

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_pack8to1.h
# Opt level: O0

void ncnn::deconvolution_pack8to1_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [24];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  float *pfVar9;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar10;
  undefined1 auVar11 [16];
  int in_stack_00000008;
  undefined4 in_stack_00000034;
  __m256 _w;
  __m256 _val;
  int k;
  float *sptr;
  int sx;
  int sxs;
  int x;
  int sy;
  int sys;
  int y;
  Mat m_2;
  int q;
  float *kptr;
  __m256 _sum;
  float sum;
  int j;
  int i;
  int outh;
  int outw;
  int channels;
  int h;
  int w;
  int maxk;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int kernel_extent_h;
  int kernel_extent_w;
  int outch;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  __m128 x32;
  __m128 x64;
  __m128 x128;
  float local_814;
  int local_6f0;
  int local_6e4;
  undefined8 local_6e0;
  undefined8 local_6d8;
  undefined8 local_6d0;
  undefined4 local_6c8;
  long local_6c0;
  undefined4 local_6b8;
  undefined4 local_6b4;
  undefined4 local_6b0;
  undefined4 local_6ac;
  undefined4 local_6a8;
  undefined8 local_6a0;
  int local_694;
  undefined8 local_690;
  undefined8 local_688;
  undefined8 local_680;
  undefined4 local_678;
  long local_670;
  undefined4 local_668;
  undefined4 local_664;
  undefined4 local_660;
  undefined4 local_65c;
  undefined4 local_658;
  undefined8 local_650;
  long local_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  float local_618;
  int local_614;
  int local_610;
  int local_60c;
  int local_608;
  int local_604;
  int local_600;
  int local_5fc;
  int local_5f8;
  undefined8 local_5e8;
  undefined8 local_5e0;
  undefined8 local_5d8;
  undefined4 local_5d0;
  long local_5c8;
  undefined4 local_5c0;
  undefined4 local_5bc;
  undefined4 local_5b8;
  undefined4 local_5b4;
  undefined4 local_5b0;
  undefined8 local_5a8;
  float *local_5a0;
  int local_594;
  long local_590;
  int local_584;
  int local_580;
  int local_57c;
  int local_578;
  int local_574;
  long *local_568;
  long *local_560;
  long *local_558;
  undefined8 *local_550;
  undefined1 local_545;
  int local_544;
  undefined8 *local_538;
  undefined8 *local_528;
  undefined8 *local_518;
  undefined8 *local_508;
  undefined8 *local_4e0;
  undefined8 *local_4c0;
  undefined8 *local_4a0;
  undefined1 local_485;
  int local_484;
  undefined8 *local_478;
  undefined1 local_455;
  int local_454;
  undefined8 *local_448;
  undefined8 *local_428;
  int local_414;
  undefined8 *local_410;
  float local_404;
  float local_400;
  float local_3fc;
  float local_3f8;
  float local_3f4;
  float local_3f0;
  float local_3ec;
  float local_3e8;
  float local_3e4;
  long *local_3e0;
  int local_3d8;
  float local_3d4 [3];
  long *local_3c8;
  undefined8 local_3c0;
  long *local_3b8;
  undefined8 local_3b0;
  long *local_3a8;
  undefined8 local_3a0;
  long *local_398;
  undefined8 local_390;
  long *local_388;
  long local_380;
  undefined4 local_374;
  long local_370;
  long local_368;
  undefined4 local_35c;
  int local_358;
  int local_354;
  undefined8 *local_350;
  long local_348;
  undefined4 local_33c;
  long local_338;
  long local_330;
  undefined4 local_324;
  int local_320;
  int local_31c;
  undefined8 *local_318;
  long local_310;
  undefined4 local_304;
  long local_300;
  float *local_2f8;
  undefined4 local_2ec;
  int local_2e8;
  int local_2e4;
  undefined8 *local_2e0;
  undefined4 local_2d4;
  long local_2d0;
  undefined4 local_2c4;
  long local_2c0;
  undefined4 local_2b4;
  long local_2b0;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 *local_230;
  undefined1 (*local_228) [32];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  ulong local_130;
  undefined8 uStack_128;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float local_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  float local_60;
  float fStack_5c;
  float fStack_58;
  float fStack_54;
  undefined1 local_50 [16];
  ulong local_40;
  undefined8 uStack_38;
  
  local_57c = (int)in_RSI[7];
  local_580 = in_stack_00000008 * (in_R8D + -1) + 1;
  local_584 = dilation_w * (in_R9D + -1) + 1;
  local_590 = *in_RCX;
  local_578 = in_R9D;
  local_574 = in_R8D;
  local_568 = in_RDX;
  local_560 = in_RSI;
  local_558 = in_RDI;
  for (local_594 = 0; local_594 < local_57c; local_594 = local_594 + 1) {
    local_538 = &local_5e8;
    local_2e4 = *(int *)((long)local_560 + 0x2c);
    local_2e8 = (int)local_560[6];
    local_2ec = *(undefined4 *)((long)local_560 + 0x34);
    local_5a0 = (float *)(*local_560 + local_560[8] * (long)local_594 * local_560[2]);
    local_300 = local_560[2];
    local_304 = (undefined4)local_560[3];
    local_310 = local_560[4];
    local_2e0 = &local_5e8;
    local_2d0 = (long)local_2e4 * (long)local_2e8 * local_300;
    local_550 = &local_5e8;
    local_528 = &local_5e8;
    local_2d4 = 0x10;
    local_544 = local_594;
    local_545 = 1;
    local_5e8 = 0;
    local_5d8 = 0;
    local_5d0 = 0;
    local_5c0 = 0;
    local_5bc = 0;
    local_5b8 = 0;
    local_5b4 = 0;
    local_5b0 = 0;
    local_5a8 = 0;
    local_5e0 = 0;
    local_5f8 = local_574 * local_578;
    local_5fc = *(int *)((long)local_558 + 0x2c);
    local_600 = (int)local_558[6];
    local_604 = (int)local_558[7];
    local_608 = *(int *)((long)local_560 + 0x2c);
    local_60c = (int)local_560[6];
    local_4a0 = local_528;
    local_2f8 = local_5a0;
    local_5c8 = local_310;
    for (local_610 = 0; local_610 < local_60c; local_610 = local_610 + 1) {
      for (local_614 = 0; local_614 < local_608; local_614 = local_614 + 1) {
        local_618 = 0.0;
        if (local_590 != 0) {
          local_618 = *(float *)(local_590 + (long)local_594 * 4);
        }
        local_448 = &local_690;
        local_354 = *(int *)((long)local_568 + 0x2c);
        local_358 = (int)local_568[6];
        local_35c = *(undefined4 *)((long)local_568 + 0x34);
        local_368 = *local_568 + local_568[8] * (long)local_594 * local_568[2];
        local_370 = local_568[2];
        local_374 = (undefined4)local_568[3];
        local_380 = local_568[4];
        local_350 = &local_690;
        local_2b0 = (long)local_354 * (long)local_358 * local_370;
        local_428 = &local_690;
        local_518 = &local_690;
        uStack_248 = 0;
        uStack_250 = 0;
        uStack_258 = 0;
        local_260 = 0;
        local_2b4 = 0x10;
        local_454 = local_594;
        local_455 = 1;
        uStack_628 = 0;
        uStack_630 = 0;
        uStack_638 = 0;
        local_640 = 0;
        local_690 = 0;
        local_680 = 0;
        local_678 = 0;
        local_668 = 0;
        local_664 = 0;
        local_660 = 0;
        local_65c = 0;
        local_658 = 0;
        local_650 = 0;
        local_688 = 0;
        local_648 = local_368;
        for (local_694 = 0; local_694 < local_604; local_694 = local_694 + 1) {
          local_478 = &local_6e0;
          local_31c = *(int *)((long)local_558 + 0x2c);
          local_320 = (int)local_558[6];
          local_324 = *(undefined4 *)((long)local_558 + 0x34);
          local_330 = *local_558 + local_558[8] * (long)local_694 * local_558[2];
          local_338 = local_558[2];
          local_33c = (undefined4)local_558[3];
          local_348 = local_558[4];
          local_318 = &local_6e0;
          local_2c0 = (long)local_31c * (long)local_320 * local_338;
          for (local_6e4 = 0; local_6e4 < local_578; local_6e4 = local_6e4 + 1) {
            iVar7 = (local_610 + local_6e4 * dilation_w) - (local_584 + -1);
            if (((-1 < iVar7) && (iVar7 % stride_w == 0)) &&
               (iVar7 = iVar7 / stride_w, iVar7 < local_600)) {
              for (local_6f0 = 0; local_6f0 < local_574; local_6f0 = local_6f0 + 1) {
                iVar8 = (local_614 + local_6f0 * in_stack_00000008) - (local_580 + -1);
                if (((-1 < iVar8) && (iVar8 % dilation_h == 0)) && (iVar8 / dilation_h < local_5fc))
                {
                  local_410 = &local_6e0;
                  local_228 = (undefined1 (*) [32])
                              (local_330 + (long)local_31c * (long)iVar7 * local_338 +
                              (long)(iVar8 / dilation_h << 3) * 4);
                  auVar2 = *(undefined1 (*) [24])*local_228;
                  local_230 = (undefined8 *)
                              (local_648 + (long)((local_6e4 * local_574 + local_6f0) * 8) * 4);
                  local_200 = *local_230;
                  uStack_1f8 = local_230[1];
                  uStack_1f0 = local_230[2];
                  uStack_1e8 = local_230[3];
                  local_220 = local_640;
                  uStack_218 = uStack_638;
                  uStack_210 = uStack_630;
                  uStack_208 = uStack_628;
                  local_1e0._0_4_ = auVar2._0_4_;
                  local_1e0._4_4_ = auVar2._4_4_;
                  fStack_1d8 = auVar2._8_4_;
                  fStack_1d4 = auVar2._12_4_;
                  fStack_1d0 = auVar2._16_4_;
                  fStack_1cc = auVar2._20_4_;
                  fStack_1c8 = (float)*(undefined8 *)(*local_228 + 0x18);
                  fStack_1c4 = (float)((ulong)*(undefined8 *)(*local_228 + 0x18) >> 0x20);
                  local_160 = (float)local_1e0._0_4_;
                  fStack_15c = (float)local_1e0._4_4_;
                  fStack_158 = fStack_1d8;
                  fStack_154 = fStack_1d4;
                  fStack_150 = fStack_1d0;
                  fStack_14c = fStack_1cc;
                  fStack_148 = fStack_1c8;
                  fStack_144 = fStack_1c4;
                  local_180._0_4_ = (float)local_200;
                  local_180._4_4_ = (float)((ulong)local_200 >> 0x20);
                  uStack_178._0_4_ = (float)uStack_1f8;
                  uStack_178._4_4_ = (float)((ulong)uStack_1f8 >> 0x20);
                  uStack_170._0_4_ = (float)uStack_1f0;
                  uStack_170._4_4_ = (float)((ulong)uStack_1f0 >> 0x20);
                  uStack_168._0_4_ = (float)uStack_1e8;
                  local_1a0._4_4_ = (float)local_1e0._4_4_ * local_180._4_4_;
                  local_1a0._0_4_ = (float)local_1e0._0_4_ * (float)local_180;
                  local_1a0._8_4_ = fStack_1d8 * (float)uStack_178;
                  local_1a0._12_4_ = fStack_1d4 * uStack_178._4_4_;
                  local_1a0._16_4_ = fStack_1d0 * (float)uStack_170;
                  local_1a0._20_4_ = fStack_1cc * uStack_170._4_4_;
                  local_1a0._24_4_ = fStack_1c8 * (float)uStack_168;
                  local_1a0._28_4_ = fStack_1c4;
                  local_1c0 = local_640;
                  uVar3 = local_1c0;
                  uStack_1b8 = uStack_638;
                  uVar4 = uStack_1b8;
                  uStack_1b0 = uStack_630;
                  uVar5 = uStack_1b0;
                  uStack_1a8 = uStack_628;
                  uVar6 = uStack_1a8;
                  local_1c0._0_4_ = (float)local_640;
                  local_1c0._4_4_ = (float)((ulong)local_640 >> 0x20);
                  uStack_1b8._0_4_ = (float)uStack_638;
                  uStack_1b8._4_4_ = (float)((ulong)uStack_638 >> 0x20);
                  uStack_1b0._0_4_ = (float)uStack_630;
                  uStack_1b0._4_4_ = (float)((ulong)uStack_630 >> 0x20);
                  uStack_1a8._0_4_ = (float)uStack_628;
                  uStack_1a8._4_4_ = (float)((ulong)uStack_628 >> 0x20);
                  local_640 = CONCAT44((float)local_1e0._4_4_ * local_180._4_4_ + local_1c0._4_4_,
                                       (float)local_1e0._0_4_ * (float)local_180 + (float)local_1c0)
                  ;
                  uStack_638 = CONCAT44(fStack_1d4 * uStack_178._4_4_ + uStack_1b8._4_4_,
                                        fStack_1d8 * (float)uStack_178 + (float)uStack_1b8);
                  uStack_630 = CONCAT44(fStack_1cc * uStack_170._4_4_ + uStack_1b0._4_4_,
                                        fStack_1d0 * (float)uStack_170 + (float)uStack_1b0);
                  uStack_628 = CONCAT44(fStack_1c4 + uStack_1a8._4_4_,
                                        fStack_1c8 * (float)uStack_168 + (float)uStack_1a8);
                  local_414 = iVar7;
                  _local_1e0 = *local_228;
                  local_1c0 = uVar3;
                  uStack_1b8 = uVar4;
                  uStack_1b0 = uVar5;
                  uStack_1a8 = uVar6;
                  local_180 = local_200;
                  uStack_178 = uStack_1f8;
                  uStack_170 = uStack_1f0;
                  uStack_168 = uStack_1e8;
                }
              }
            }
          }
          local_648 = local_648 + (long)(local_5f8 << 3) * 4;
          local_508 = &local_6e0;
          local_2c4 = 0x10;
          local_484 = local_694;
          local_485 = 1;
          local_6e0 = 0;
          local_6d0 = 0;
          local_6c8 = 0;
          local_6b8 = 0;
          local_6b4 = 0;
          local_6b0 = 0;
          local_6ac = 0;
          local_6a8 = 0;
          local_6a0 = 0;
          local_6d8 = 0;
          local_4e0 = local_508;
          local_6c0 = local_348;
        }
        local_100 = local_640;
        uStack_f8 = uStack_638;
        uStack_f0 = uStack_630;
        uStack_e8 = uStack_628;
        local_a0 = local_640;
        uStack_98 = uStack_638;
        uStack_90 = uStack_630;
        uStack_88 = uStack_628;
        local_b0 = uStack_630;
        uVar5 = local_b0;
        uStack_a8 = uStack_628;
        uVar6 = uStack_a8;
        local_c0 = local_640;
        uVar3 = local_c0;
        uStack_b8 = uStack_638;
        uVar4 = uStack_b8;
        local_b0._0_4_ = (float)uStack_630;
        local_b0._4_4_ = (float)((ulong)uStack_630 >> 0x20);
        uStack_a8._0_4_ = (float)uStack_628;
        uStack_a8._4_4_ = (float)((ulong)uStack_628 >> 0x20);
        local_c0._0_4_ = (float)local_640;
        local_c0._4_4_ = (float)((ulong)local_640 >> 0x20);
        uStack_b8._0_4_ = (float)uStack_638;
        uStack_b8._4_4_ = (float)((ulong)uStack_638 >> 0x20);
        local_110 = (float)local_b0 + (float)local_c0;
        fStack_10c = local_b0._4_4_ + local_c0._4_4_;
        fStack_108 = (float)uStack_a8 + (float)uStack_b8;
        fStack_104 = uStack_a8._4_4_ + uStack_b8._4_4_;
        local_d0 = CONCAT44(fStack_10c,local_110);
        uStack_c8 = CONCAT44(fStack_104,fStack_108);
        auVar1._8_8_ = uStack_c8;
        auVar1._0_8_ = local_d0;
        auVar11._8_8_ = uStack_c8;
        auVar11._0_8_ = local_d0;
        _local_e0 = vunpckhpd_avx(auVar11,auVar1);
        local_120 = local_110 + (float)local_e0._0_4_;
        fStack_11c = fStack_10c + (float)local_e0._4_4_;
        fStack_118 = fStack_108 + fStack_d8;
        fStack_114 = fStack_104 + fStack_d4;
        local_50._0_4_ = local_120 + fStack_11c;
        auVar11 = ZEXT416((uint)local_50._0_4_);
        local_50._4_4_ = 0;
        local_130 = local_50._0_8_;
        uStack_128 = 0;
        local_40 = local_50._0_8_;
        uStack_38 = 0;
        local_814 = local_618 + (float)local_50._0_4_;
        local_3e0 = (long *)CONCAT44(in_stack_00000034,activation_type);
        local_3d8 = stride_h;
        local_3d4[0] = local_814;
        local_618 = local_814;
        local_4c0 = local_518;
        local_c0 = uVar3;
        uStack_b8 = uVar4;
        local_b0 = uVar5;
        uStack_a8 = uVar6;
        local_80 = local_d0;
        uStack_78 = uStack_c8;
        local_70 = local_d0;
        uStack_68 = uStack_c8;
        local_60 = fStack_11c;
        fStack_5c = fStack_11c;
        fStack_58 = fStack_11c;
        fStack_54 = fStack_11c;
        local_50 = auVar11;
        local_670 = local_380;
        switch(stride_h) {
        case 1:
          dVar10 = std::fmax((double)(ulong)(uint)local_814,0.0);
          local_3d4[0] = SUB84(dVar10,0);
          break;
        case 2:
          local_390 = 0;
          local_3e4 = *(float *)*local_3e0;
          if (local_814 <= 0.0) {
            local_814 = local_814 * local_3e4;
          }
          local_3d4[0] = local_814;
          local_388 = local_3e0;
          break;
        case 3:
          local_3a0 = 0;
          local_3e8 = *(float *)*local_3e0;
          local_3b0 = 1;
          local_3ec = *(float *)(*local_3e0 + 4);
          if (local_814 < local_3e8) {
            local_3d4[0] = local_3e8;
          }
          local_3a8 = local_3e0;
          local_398 = local_3e0;
          if (local_3ec < local_3d4[0]) {
            local_3d4[0] = local_3ec;
          }
          break;
        case 4:
          local_3f0 = 88.37626;
          pfVar9 = std::min<float>(local_3d4,&local_3f0);
          local_3d4[0] = *pfVar9;
          local_3f4 = -88.37626;
          pfVar9 = std::max<float>(local_3d4,&local_3f4);
          local_3d4[0] = *pfVar9;
          dVar10 = std::exp((double)(ulong)(uint)-local_3d4[0]);
          local_3d4[0] = 1.0 / (SUB84(dVar10,0) + 1.0);
          break;
        case 5:
          dVar10 = std::exp((double)(ulong)(uint)local_814);
          dVar10 = std::log((double)(ulong)(uint)(SUB84(dVar10,0) + 1.0));
          dVar10 = std::tanh(dVar10);
          local_3d4[0] = local_814 * SUB84(dVar10,0);
          break;
        case 6:
          local_3c0 = 0;
          local_3f8 = *(float *)*local_3e0;
          local_3d4[1] = 1.4013e-45;
          local_3d4[2] = 0.0;
          local_3fc = *(float *)(*local_3e0 + 4);
          local_400 = -local_3fc / local_3f8;
          local_404 = 1.0 / local_3f8 + local_400;
          local_3c8 = local_3e0;
          local_3b8 = local_3e0;
          if (local_400 <= local_814) {
            if (local_814 <= local_404) {
              local_3d4[0] = local_814 * (local_814 * local_3f8 + local_3fc);
            }
          }
          else {
            local_3d4[0] = 0.0;
          }
        }
        *local_5a0 = local_3d4[0];
        local_5a0 = local_5a0 + 1;
      }
    }
  }
  return;
}

Assistant:

static void deconvolution_pack8to1_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int outch = top_blob.c;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const float* bias_data_ptr = bias_data;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        const int maxk = kernel_w * kernel_h;

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int channels = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_data_ptr)
                {
                    sum = bias_data_ptr[p];
                }

                __m256 _sum = _mm256_setzero_ps();

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);

                    for (int y = 0; y < kernel_h; y++)
                    {
                        int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                        if (sys < 0 || sys % stride_h != 0)
                            continue;

                        int sy = sys / stride_h;
                        if (sy >= h)
                            continue;

                        for (int x = 0; x < kernel_w; x++)
                        {
                            int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                            if (sxs < 0 || sxs % stride_w != 0)
                                continue;

                            int sx = sxs / stride_w;
                            if (sx >= w)
                                continue;

                            const float* sptr = m.row(sy) + sx * 8;

                            int k = y * kernel_w + x;

                            __m256 _val = _mm256_load_ps(sptr);
                            __m256 _w = _mm256_load_ps(kptr + k * 8);
                            _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                        }
                    }

                    kptr += maxk * 8;
                }

                sum += _mm256_reduce_add_ps(_sum);

                sum = activation_ss(sum, activation_type, activation_params);

                outptr[0] = sum;
                outptr++;
            }
        }
    }
}